

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormat::_InternalSerialize
                    (Message *message,uint8_t *target,EpsCopyOutputStream *stream)

{
  pointer ppFVar1;
  Descriptor *this;
  UnknownFieldSet *pUVar2;
  uint8_t *puVar3;
  Reflection *this_00;
  int i;
  int index;
  pointer ppFVar4;
  Metadata MVar5;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  FieldDescriptor *local_38;
  
  MVar5 = Message::GetMetadata(message);
  this = MVar5.descriptor;
  MVar5 = Message::GetMetadata(message);
  this_00 = MVar5.reflection;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->options_->field_0)._impl_.map_entry_ == true) {
    for (index = 0; ppFVar4 = local_58._M_impl.super__Vector_impl_data._M_start,
        ppFVar1 = local_58._M_impl.super__Vector_impl_data._M_finish, index < this->field_count_;
        index = index + 1) {
      local_38 = Descriptor::field(this,index);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&local_58,&local_38);
    }
  }
  else {
    Reflection::ListFields
              (this_00,message,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&local_58);
    ppFVar4 = local_58._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = local_58._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppFVar4 != ppFVar1; ppFVar4 = ppFVar4 + 1) {
    target = InternalSerializeField(*ppFVar4,message,target,stream);
  }
  if ((this->options_->field_0)._impl_.message_set_wire_format_ == true) {
    pUVar2 = Reflection::GetUnknownFields(this_00,message);
    puVar3 = InternalSerializeUnknownMessageSetItemsToArray(pUVar2,target,stream);
  }
  else {
    pUVar2 = Reflection::GetUnknownFields(this_00,message);
    puVar3 = InternalSerializeUnknownFieldsToArray(pUVar2,target,stream);
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_58);
  return puVar3;
}

Assistant:

uint8_t* WireFormat::_InternalSerialize(const Message& message, uint8_t* target,
                                        io::EpsCopyOutputStream* stream) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (auto field : fields) {
    target = InternalSerializeField(field, message, target, stream);
  }

  if (descriptor->options().message_set_wire_format()) {
    return InternalSerializeUnknownMessageSetItemsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  } else {
    return InternalSerializeUnknownFieldsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  }
}